

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonQuoteFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  JsonString local_98;
  
  local_98.zBuf = local_98.zSpace;
  local_98.nAlloc = 100;
  local_98.nUsed = 0;
  local_98.bStatic = '\x01';
  local_98.bErr = '\0';
  local_98.pCtx = ctx;
  jsonAppendValue(&local_98,*argv);
  if (local_98.bErr == '\0') {
    sqlite3_result_text64
              (local_98.pCtx,local_98.zBuf,local_98.nUsed,
               (_func_void_void_ptr *)(-(ulong)(local_98.bStatic != '\0') | 0x11c6fa),'\x01');
  }
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

static void jsonQuoteFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString jx;
  UNUSED_PARAM(argc);

  jsonInit(&jx, ctx);
  jsonAppendValue(&jx, argv[0]);
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}